

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int setDateTimeToCurrent(sqlite3_context *context,DateTime *p)

{
  bool bVar1;
  sqlite3_int64 sVar2;
  DateTime *p_local;
  sqlite3_context *context_local;
  
  sVar2 = sqlite3StmtCurrentTime(context);
  p->iJD = sVar2;
  bVar1 = p->iJD < 1;
  if (!bVar1) {
    p->validJD = '\x01';
  }
  context_local._4_4_ = (uint)bVar1;
  return context_local._4_4_;
}

Assistant:

static int setDateTimeToCurrent(sqlite3_context *context, DateTime *p){
  p->iJD = sqlite3StmtCurrentTime(context);
  if( p->iJD>0 ){
    p->validJD = 1;
    return 0;
  }else{
    return 1;
  }
}